

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

void __thiscall SimpleASTNode::eval(SimpleASTNode *this,int level)

{
  list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_> *plVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint __val;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  iterator iVar8;
  ostream *poVar9;
  _Elt_pointer psVar10;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  size_type sVar14;
  undefined4 in_register_00000034;
  char *pcVar15;
  string *psVar16;
  uint __len;
  list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_> *__range1;
  int iVar17;
  _List_node_base *p_Var18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
  *psVar20;
  undefined1 auStack_c8 [8];
  string __str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Elt_pointer local_88;
  _Map_pointer ppsStack_80;
  SimpleASTNode *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined8 local_68;
  ASTNodeType local_5c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 auStack_48 [8];
  Ptr result;
  
  local_68 = CONCAT44(in_register_00000034,level);
  plVar1 = &this->m_childList;
  p_Var18 = (this->m_childList).
            super__List_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (level == 0) {
    if (p_Var18 == (_List_node_base *)plVar1) {
      if (this->m_type == INT_LITERAL) {
        pcVar15 = (this->m_text)._M_dataplus._M_p;
        sVar14 = (this->m_text)._M_string_length;
        poVar9 = (ostream *)&std::cout;
      }
      else {
        if (this->m_type != ID) {
          return;
        }
        iVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&m_varMap_abi_cxx11_._M_h,&this->m_text);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Undefined var \'",0xf);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(this->m_text)._M_dataplus._M_p,
                              (this->m_text)._M_string_length);
          pcVar15 = "\'";
          sVar14 = 1;
        }
        else {
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(this->m_text)._M_dataplus._M_p,
                              (this->m_text)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
          pcVar15 = *(char **)((long)iVar8.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                     ._M_cur + 0x28);
          sVar14 = *(size_type *)
                    ((long)iVar8.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                           ._M_cur + 0x30);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,sVar14);
      return;
    }
  }
  else if (p_Var18 == (_List_node_base *)plVar1) {
    return;
  }
  p_Var18 = (this->m_childList).
            super__List_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var18 != (_List_node_base *)plVar1) {
    do {
      eval((SimpleASTNode *)p_Var18[1]._M_next,level + 1);
      if (*(int *)&(p_Var18[1]._M_next)->_M_next - 1U < 2) {
        std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ::push_back(&m_evalStack.c,(value_type *)(p_Var18 + 1));
      }
      p_Var18 = p_Var18->_M_next;
    } while (p_Var18 != (_List_node_base *)plVar1);
  }
  if (this->m_type - ADDITIVE_EXP < 2) {
    psVar20 = &m_evalStack;
    psVar10 = m_evalStack.c.
              super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar10 = m_evalStack.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar2 = psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58 = psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_58->_M_use_count = local_58->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_58->_M_use_count = local_58->_M_use_count + 1;
      }
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    psVar10 = m_evalStack.c.
              super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar10 = m_evalStack.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar3 = psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var19 = psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
      }
    }
    local_50 = p_Var19;
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    if (peVar3->m_type == INT_LITERAL) {
      uVar5 = atoi((peVar3->m_text)._M_dataplus._M_p);
      p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar5;
LAB_00108319:
      iVar6 = (int)psVar20;
      if (peVar2->m_type == INT_LITERAL) {
        iVar6 = atoi((peVar2->m_text)._M_dataplus._M_p);
      }
      else if (peVar2->m_type == ID) {
        iVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&m_varMap_abi_cxx11_._M_h,&peVar2->m_text);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Undefined var \'",0xf);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(peVar2->m_text)._M_dataplus._M_p,
                              (peVar2->m_text)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
          goto LAB_00108612;
        }
        iVar6 = atoi(*(char **)((long)iVar8.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                      ._M_cur + 0x28));
      }
      auStack_48 = (undefined1  [8])0x0;
      result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      psVar16 = &this->m_text;
      iVar7 = std::__cxx11::string::compare((char *)psVar16);
      iVar17 = (int)p_Var19;
      if (iVar7 == 0) {
        uVar5 = iVar6 * iVar17;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)psVar16);
        if (iVar7 == 0) {
          uVar5 = (uint)((long)((ulong)(uint)(iVar17 >> 0x1f) << 0x20 | (ulong)p_Var19 & 0xffffffff)
                        / (long)iVar6);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)psVar16);
          if (iVar7 == 0) {
            uVar5 = iVar6 + iVar17;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)psVar16);
            uVar5 = 0;
            if (iVar7 == 0) {
              uVar5 = iVar17 - iVar6;
            }
          }
        }
      }
      local_5c = INT_LITERAL;
      __val = -uVar5;
      if (0 < (int)uVar5) {
        __val = uVar5;
      }
      __len = 1;
      if (9 < __val) {
        uVar13 = (ulong)__val;
        uVar4 = 4;
        do {
          __len = uVar4;
          uVar12 = (uint)uVar13;
          if (uVar12 < 100) {
            __len = __len - 2;
            goto LAB_0010855c;
          }
          if (uVar12 < 1000) {
            __len = __len - 1;
            goto LAB_0010855c;
          }
          if (uVar12 < 10000) goto LAB_0010855c;
          uVar13 = uVar13 / 10000;
          uVar4 = __len + 4;
        } while (99999 < uVar12);
        __len = __len + 1;
      }
LAB_0010855c:
      auStack_c8 = (undefined1  [8])&__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)auStack_c8,(char)__len - (char)((int)uVar5 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)auStack_c8 + (ulong)(uVar5 >> 0x1f)),__len,__val);
      local_78 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SimpleASTNode,std::allocator<SimpleASTNode>,ASTNodeType_const&,std::__cxx11::string_const&>
                (&_Stack_70,&local_78,
                 (allocator<SimpleASTNode> *)
                 ((long)&result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7),&local_5c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8);
      peVar2 = result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Stack_70._M_pi;
      auStack_48 = (undefined1  [8])local_78;
      local_78 = (SimpleASTNode *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (peVar2 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2);
      }
      if ((element_type *)_Stack_70._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      }
      if (auStack_c8 != (undefined1  [8])&__str._M_string_length) {
        operator_delete((void *)auStack_c8);
      }
      std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
      push_back(&m_evalStack.c,(value_type *)auStack_48);
      if (result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    else {
      if (peVar3->m_type != ID) goto LAB_00108319;
      psVar20 = (stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
                 *)std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&m_varMap_abi_cxx11_._M_h,&peVar3->m_text);
      if ((__node_type *)psVar20 != (__node_type *)0x0) {
        uVar5 = atoi(*(char **)((long)psVar20 + 0x28));
        p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar5;
        goto LAB_00108319;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Undefined var \'",0xf);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(peVar3->m_text)._M_dataplus._M_p,
                          (peVar3->m_text)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
    }
LAB_00108612:
    p_Var19 = local_58;
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      p_Var19 = local_58;
    }
  }
  else {
    if (this->m_type != ASSIGMENT) goto LAB_0010862e;
    psVar10 = m_evalStack.c.
              super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar10 = m_evalStack.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar2 = psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var19 = psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
      }
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    psVar10 = m_evalStack.c.
              super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar10 = m_evalStack.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar3 = psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    if (peVar3->m_type == ID) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_c8,&peVar3->m_text,&peVar2->m_text);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&m_varMap_abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str.field_2._8_8_ != &local_98) {
        operator_delete((void *)__str.field_2._8_8_);
      }
      if (auStack_c8 != (undefined1  [8])&__str._M_string_length) {
        operator_delete((void *)auStack_c8);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
  }
LAB_0010862e:
  if ((int)local_68 == 0) {
    local_88 = (_Elt_pointer)0x0;
    ppsStack_80 = (_Map_pointer)0x0;
    local_98._M_allocated_capacity = 0;
    local_98._8_8_ = 0;
    __str.field_2._8_8_ = 0;
    __str._M_string_length = 0;
    __str.field_2._M_allocated_capacity = 0;
    auStack_c8 = (undefined1  [8])0x0;
    __str._M_dataplus._M_p = (pointer)0x0;
    std::
    _Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    _M_initialize_map((_Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                       *)auStack_c8,0);
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        psVar10 = m_evalStack.c.
                  super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (m_evalStack.c.
            super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            m_evalStack.c.
            super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar10 = m_evalStack.c.
                    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        auStack_48 = (undefined1  [8])
                     psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
        result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             psVar10[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_text)._M_dataplus._M_p =
                 *(int *)&((result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_text)._M_dataplus._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&((result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_text)._M_dataplus._M_p =
                 *(int *)&((result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_text)._M_dataplus._M_p + 1;
          }
        }
        std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ::pop_back(&m_evalStack.c);
        std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ::push_back((deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                     *)auStack_c8,(value_type *)auStack_48);
        if (result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      } while (m_evalStack.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               m_evalStack.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    if (local_98._M_allocated_capacity != __str._M_string_length) {
      do {
        uVar11 = local_98._M_allocated_capacity;
        if (local_98._M_allocated_capacity == local_98._8_8_) {
          uVar11 = ppsStack_80[-1] + 0x20;
        }
        peVar2 = (((shared_ptr<SimpleASTNode> *)(uVar11 + -0x10))->
                 super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var19 = (((shared_ptr<SimpleASTNode> *)(uVar11 + -0x10))->
                  super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
          }
        }
        std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ::pop_back((deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                    *)auStack_c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(peVar2->m_text)._M_dataplus._M_p,
                   (peVar2->m_text)._M_string_length);
        if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
        }
      } while (local_98._M_allocated_capacity != __str._M_string_length);
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    ~deque((deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            *)auStack_c8);
  }
  return;
}

Assistant:

void SimpleASTNode::eval(int level)
{
    //Recursive ending condition
    if (level && m_childList.empty())
        return;
    else if (!level && m_childList.empty()) {
        //std::cout << "here";
        if (m_type == ASTNodeType::ID) {
            auto search = m_varMap.find(m_text);
            if (search != m_varMap.end()) {
                std::cout << m_text << ": " << search->second;
            } else {
                std::cout << "Undefined var \'" << m_text << "\'";
            }            
        } else if (m_type == ASTNodeType::INT_LITERAL) {
            std::cout << m_text;
        }
        return;
    }
    for (auto& item : m_childList) {
        item->eval(level + 1);
        if (item->m_type == ASTNodeType::ID || item->m_type == ASTNodeType::INT_LITERAL) {
            m_evalStack.push(item);
        }
    }
    switch (m_type) {
        case ASTNodeType::DECLARATION:
            break;
        case ASTNodeType::MULTIL_EXP:
        case ASTNodeType::ADDITIVE_EXP:
        {
            SimpleASTNode::Ptr child2 = m_evalStack.top();
            m_evalStack.pop();
            SimpleASTNode::Ptr child1 = m_evalStack.top();
            m_evalStack.pop();
            int iChild1;
            int iChild2;
            if (child1->m_type == ASTNodeType::ID) {
                auto search = m_varMap.find(child1->m_text);
                if (search != m_varMap.end()) {
                    iChild1 = atoi((search->second).c_str());
                } else {
                    std::cout << "Undefined var \'" << child1->m_text << "\'";
                    break;
                }
            } else if (child1->m_type == ASTNodeType::INT_LITERAL) {
                iChild1 = atoi((child1->m_text).c_str());
            }
            if (child2->m_type == ASTNodeType::ID) {
                auto search = m_varMap.find(child2->m_text);
                if (search != m_varMap.end()) {
                    iChild2 = atoi((search->second).c_str());
                } else {
                    std::cout << "Undefined var \'" << child2->m_text << "\'";
                    break;
                }
            } else if (child2->m_type == ASTNodeType::INT_LITERAL) {
                iChild2 = atoi((child2->m_text).c_str());
            }
            int iResult = 0;
            SimpleASTNode::Ptr result;
            if (!m_text.compare({"*"})) {
                iResult = iChild1 * iChild2;
            } else if (!m_text.compare({"/"})) {
                iResult = iChild1 / iChild2;
            } else if (!m_text.compare({"+"})) {
                iResult = iChild1 + iChild2;
            } else if (!m_text.compare({"-"})) {
                iResult = iChild1 - iChild2;
            }
            result = SimpleASTNode::create(ASTNodeType::INT_LITERAL, std::to_string(iResult));
            m_evalStack.push(result);            
        }
            break;      
        case ASTNodeType::ASSIGMENT:
        {
            SimpleASTNode::Ptr child2 = m_evalStack.top();
            m_evalStack.pop();
            SimpleASTNode::Ptr child1 = m_evalStack.top();
            m_evalStack.pop();
            if (child1->m_type == ASTNodeType::ID) {
                m_varMap.insert({child1->m_text, child2->m_text});
            }
        }   
            break;
        default:
            break;     
    }

    //Handle the final results
    if (!level) {
        std::stack<SimpleASTNode::Ptr> tmp;
        while (!m_evalStack.empty()) {
            SimpleASTNode::Ptr node = m_evalStack.top();
            m_evalStack.pop();
            tmp.push(node);
        }
        while (!tmp.empty()) {
            SimpleASTNode::Ptr node = tmp.top();
            tmp.pop();
            std::cout << node->m_text;
        }
    }
}